

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

void loguru::write_hex_digit(string *out,uint num)

{
  uint val_right;
  uint val_left;
  Text str_right;
  Text str_left;
  Text fail_info;
  Text user_msg;
  
  val_left = (uint)out;
  val_right = 0x10;
  if (val_left < 0x10) {
    std::__cxx11::string::push_back(-0x68);
    return;
  }
  format_value<unsigned_int>((loguru *)&str_left,&val_left);
  format_value<unsigned_int>((loguru *)&str_right,&val_right);
  textprintf((loguru *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","num","<","16u",
             str_left._str,"<",str_right._str);
  textprintf();
  log_and_abort(0,fail_info._str,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                ,0x1df,"%s",user_msg._str);
}

Assistant:

static void write_hex_digit(std::string& out, unsigned num)
	{
		DCHECK_LT_F(num, 16u);
		if (num < 10u) { out.push_back(char('0' + num)); }
		else { out.push_back(char('A' + num - 10)); }
	}